

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timBox.c
# Opt level: O1

int Tim_ManBoxOutputLast(Tim_Man_t *p,int iBox)

{
  int iVar1;
  void *pvVar2;
  int iVar3;
  
  if ((-1 < iBox) && (iBox < p->vBoxes->nSize)) {
    pvVar2 = p->vBoxes->pArray[(uint)iBox];
    iVar1 = *(int *)((long)pvVar2 + (long)*(int *)((long)pvVar2 + 8) * 4 + 0x1c);
    iVar3 = Tim_ManBoxOutputNum(p,iBox);
    return iVar3 + iVar1 + -1;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

int Tim_ManBoxOutputLast( Tim_Man_t * p, int iBox )
{
    return Tim_ManBox(p, iBox)->Inouts[Tim_ManBox(p, iBox)->nInputs] + Tim_ManBoxOutputNum(p, iBox) - 1;
}